

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx *cctx,ZSTD_compressionParameters cparams)

{
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters ZVar1;
  uint uVar2;
  undefined8 in_stack_ffffffffffffff94;
  size_t err_code_7;
  size_t err_code_6;
  size_t err_code_5;
  size_t err_code_4;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  ZSTD_CCtx *cctx_local;
  
  ZVar1 = cparams;
  cParams._20_8_ = in_stack_ffffffffffffff94;
  cParams.windowLog = cparams.hashLog;
  cParams.chainLog = cparams.searchLog;
  cParams.hashLog = cparams.minMatch;
  cParams.searchLog = cparams.targetLength;
  cParams.minMatch = cparams.strategy;
  cctx_local = (ZSTD_CCtx *)ZSTD_checkCParams(cParams);
  uVar2 = ERR_isError((size_t)cctx_local);
  if (uVar2 == 0) {
    cparams.windowLog = ZVar1.windowLog;
    cctx_local = (ZSTD_CCtx *)ZSTD_CCtx_setParameter(cctx,ZSTD_c_windowLog,cparams.windowLog);
    uVar2 = ERR_isError((size_t)cctx_local);
    if (uVar2 == 0) {
      cparams.chainLog = ZVar1.chainLog;
      cctx_local = (ZSTD_CCtx *)ZSTD_CCtx_setParameter(cctx,ZSTD_c_chainLog,cparams.chainLog);
      uVar2 = ERR_isError((size_t)cctx_local);
      if (uVar2 == 0) {
        cparams.hashLog = ZVar1.hashLog;
        cctx_local = (ZSTD_CCtx *)ZSTD_CCtx_setParameter(cctx,ZSTD_c_hashLog,cparams.hashLog);
        uVar2 = ERR_isError((size_t)cctx_local);
        if (uVar2 == 0) {
          cparams.searchLog = ZVar1.searchLog;
          cctx_local = (ZSTD_CCtx *)ZSTD_CCtx_setParameter(cctx,ZSTD_c_searchLog,cparams.searchLog);
          uVar2 = ERR_isError((size_t)cctx_local);
          if (uVar2 == 0) {
            cparams.minMatch = ZVar1.minMatch;
            cctx_local = (ZSTD_CCtx *)ZSTD_CCtx_setParameter(cctx,ZSTD_c_minMatch,cparams.minMatch);
            uVar2 = ERR_isError((size_t)cctx_local);
            if (uVar2 == 0) {
              cparams.targetLength = ZVar1.targetLength;
              cctx_local = (ZSTD_CCtx *)
                           ZSTD_CCtx_setParameter(cctx,ZSTD_c_targetLength,cparams.targetLength);
              uVar2 = ERR_isError((size_t)cctx_local);
              if (uVar2 == 0) {
                cparams.strategy = ZVar1.strategy;
                cctx_local = (ZSTD_CCtx *)
                             ZSTD_CCtx_setParameter(cctx,ZSTD_c_strategy,cparams.strategy);
                uVar2 = ERR_isError((size_t)cctx_local);
                if (uVar2 == 0) {
                  cctx_local = (ZSTD_CCtx *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx* cctx, ZSTD_compressionParameters cparams)
{
    ZSTD_STATIC_ASSERT(sizeof(cparams) == 7 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setCParams");
    /* only update if all parameters are valid */
    FORWARD_IF_ERROR(ZSTD_checkCParams(cparams), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_windowLog, cparams.windowLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_chainLog, cparams.chainLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_hashLog, cparams.hashLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_searchLog, cparams.searchLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_minMatch, cparams.minMatch), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_targetLength, cparams.targetLength), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_strategy, cparams.strategy), "");
    return 0;
}